

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O3

void __thiscall cmConfigureLog::EnsureInit(cmConfigureLog *this)

{
  char cVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view key;
  string name;
  string local_68;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_48;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  
  if (this->Opened == false) {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      __assert_fail("!this->Stream.is_open()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmConfigureLog.cxx"
                    ,0x66,"void cmConfigureLog::EnsureInit()");
    }
    local_48.first._M_str = (this->LogDir)._M_dataplus._M_p;
    local_48.first._M_len = (this->LogDir)._M_string_length;
    local_48.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_30 = 0x17;
    local_28 = "/CMakeConfigureLog.yaml";
    local_20 = 0;
    views._M_len = 2;
    views._M_array = &local_48;
    cmCatViews(&local_68,views);
    std::ofstream::open((char *)&this->Stream,(_Ios_Openmode)local_68._M_dataplus._M_p);
    this->Opened = true;
    std::__ostream_insert<char,std::char_traits<char>>
              (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"\n---\n",5);
    key._M_str = "events";
    key._M_len = 6;
    BeginObject(this,key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmConfigureLog::EnsureInit()
{
  if (this->Opened) {
    return;
  }
  assert(!this->Stream.is_open());

  std::string name = cmStrCat(this->LogDir, "/CMakeConfigureLog.yaml");
  this->Stream.open(name.c_str(), std::ios::out | std::ios::app);

  this->Opened = true;

  this->Stream << "\n---\n";
  this->BeginObject("events"_s);
}